

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O3

void Cmd_dump3df(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  extsector_t *peVar2;
  F3DFloor *pFVar3;
  secplane_t *psVar4;
  secplane_t *psVar5;
  double dVar6;
  double dVar7;
  sector_t *psVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  
  iVar9 = FCommandLine::argc(argv);
  if (1 < iVar9) {
    pcVar10 = FCommandLine::operator[](argv,1);
    lVar11 = strtol(pcVar10,(char **)0x0,10);
    psVar8 = sectors;
    iVar9 = (int)lVar11;
    peVar2 = sectors[iVar9].e;
    if ((peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
      uVar12 = 0;
      do {
        pFVar3 = (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar12];
        psVar4 = (pFVar3->top).plane;
        dVar6 = psVar8[iVar9].centerspot.X;
        dVar7 = psVar8[iVar9].centerspot.Y;
        psVar5 = (pFVar3->bottom).plane;
        uVar1 = pFVar3->flags;
        pcVar10 = "Exists";
        if ((uVar1 & 1) == 0) {
          pcVar10 = "";
        }
        pcVar13 = "Dynamic";
        if ((uVar1 >> 0x17 & 1) == 0) {
          pcVar13 = "";
        }
        Printf("FFloor %d @ top = %f (model = %d), bottom = %f (model = %d), flags = %B, alpha = %d %s %s\n"
               ,((psVar4->normal).Y * dVar7 + psVar4->D + (psVar4->normal).X * dVar6) *
                psVar4->negiC,
               ((psVar5->normal).Y * dVar7 + psVar5->D + (psVar5->normal).X * dVar6) * psVar5->negiC
               ,uVar12 & 0xffffffff,(ulong)(uint)((pFVar3->top).model)->sectornum,
               (ulong)(uint)((pFVar3->bottom).model)->sectornum,(ulong)uVar1,
               (ulong)(uint)pFVar3->alpha,pcVar10,pcVar13);
        uVar12 = uVar12 + 1;
      } while (uVar12 < (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
    }
  }
  return;
}

Assistant:

CCMD (dump3df)
{
	if (argv.argc() > 1) 
	{
		int sec = strtol(argv[1], NULL, 10);
		sector_t *sector = &sectors[sec];
		TArray<F3DFloor*> & ffloors=sector->e->XFloor.ffloors;

		for (unsigned int i = 0; i < ffloors.Size(); i++)
		{
			double height=ffloors[i]->top.plane->ZatPoint(sector->centerspot);
			double bheight=ffloors[i]->bottom.plane->ZatPoint(sector->centerspot);

			IGNORE_FORMAT_PRE
			Printf("FFloor %d @ top = %f (model = %d), bottom = %f (model = %d), flags = %B, alpha = %d %s %s\n", 
				i, height, ffloors[i]->top.model->sectornum, 
				bheight, ffloors[i]->bottom.model->sectornum,
				ffloors[i]->flags, ffloors[i]->alpha, (ffloors[i]->flags&FF_EXISTS)? "Exists":"", (ffloors[i]->flags&FF_DYNAMIC)? "Dynamic":"");
			IGNORE_FORMAT_POST
		}
	}
}